

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneIndexPrivate::recursive_items_helper
          (QGraphicsSceneIndexPrivate *this,QGraphicsItem *item,QRectF exposeRect,
          QGraphicsSceneIndexIntersector intersect,QList<QGraphicsItem_*> *items,
          QTransform *viewTransform,ItemSelectionMode mode,qreal parentOpacity,void *intersectData)

{
  QGraphicsItem *pQVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  QGraphicsItemPrivate *pQVar5;
  qsizetype qVar6;
  const_reference ppQVar7;
  QGraphicsSceneIndexIntersector in_RCX;
  QGraphicsItem *in_RDX;
  QGraphicsSceneIndexPrivate *in_RSI;
  QList<QGraphicsItem_*> *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  bool bVar8;
  undefined8 in_XMM0_Qa;
  qreal opacity_00;
  qreal qVar9;
  qreal qVar10;
  QRectF in_stack_00000000;
  void *in_stack_00000020;
  undefined8 in_stack_00000028;
  QGraphicsItem *child_1;
  QGraphicsItem *child;
  int i;
  bool processItem;
  bool itemClipsChildrenToShape;
  bool wasDirtyParentSceneTransform;
  bool itemIsUntransformable;
  bool itemHasChildren;
  bool itemIsFullyTransparent;
  qreal opacity;
  QPainterPath mappedShape;
  parameter_type in_stack_fffffffffffffeb8;
  QRectF *in_stack_fffffffffffffec0;
  QGraphicsItemPrivate *in_stack_fffffffffffffec8;
  QGraphicsItemPrivate *in_stack_fffffffffffffed0;
  QGraphicsItemPrivate *in_stack_fffffffffffffee0;
  byte local_f1;
  int local_cc;
  byte local_c6;
  undefined4 in_stack_ffffffffffffff50;
  QPainterPath local_20 [8];
  QPainterPath local_18 [8];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  if ((*(ulong *)&pQVar5->field_0x160 >> 5 & 1) == 0) goto LAB_00a267d2;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             &in_RSI->field_0x8);
  opacity_00 = QGraphicsItemPrivate::combineOpacityFromParent
                         (in_stack_fffffffffffffec8,(qreal)in_stack_fffffffffffffec0);
  bVar2 = QGraphicsItemPrivate::isOpacityNull(opacity_00);
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             &in_RSI->field_0x8);
  bVar3 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0xa260b3);
  bVar4 = (bVar3 ^ 0xffU) & 1;
  if (bVar2) {
    if (bVar4 == 0) goto LAB_00a267d2;
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RSI->field_0x8);
    bVar3 = QGraphicsItemPrivate::childrenCombineOpacity(in_stack_fffffffffffffec8);
    if (bVar3) goto LAB_00a267d2;
  }
  pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  bVar3 = QGraphicsItemPrivate::itemIsUntransformable(pQVar5);
  pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  local_f1 = 0;
  if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x35) & 1) != 0) {
    local_f1 = bVar3 ^ 0xff;
  }
  local_f1 = local_f1 & 1;
  if (local_f1 != 0) {
    pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    (*pQVar5->_vptr_QGraphicsItemPrivate[2])();
  }
  pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->field_0x8);
  bVar8 = true;
  if ((*(ulong *)&pQVar5->field_0x160 & 0x1000000000) == 0) {
    pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RSI->field_0x8);
    bVar8 = (*(ulong *)&pQVar5->field_0x160 & 0x8000000000000) != 0;
  }
  local_c6 = (bVar2 ^ 0xffU) & 1;
  if (local_c6 != 0) {
    local_c6 = (*(code *)in_RDX)(in_RSI,&stack0x00000008,in_R9D,in_R8,in_stack_00000028);
    local_c6 = local_c6 & 1;
    if ((local_c6 == 0) && ((bVar4 == 0 || (bVar8)))) {
      if (local_f1 != 0) {
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)&in_RSI->field_0x8);
        QGraphicsItemPrivate::invalidateChildrenSceneTransform(in_stack_fffffffffffffed0);
      }
      goto LAB_00a267d2;
    }
  }
  local_cc = 0;
  if (bVar4 != 0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RSI->field_0x8);
    QGraphicsItemPrivate::ensureSortedChildren(in_stack_fffffffffffffee0);
    if ((bVar8) && (!bVar3)) {
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8);
      if ((*(ulong *)&pQVar5->field_0x160 >> 0x3e & 1) == 0) {
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)&in_RSI->field_0x8);
        (**(code **)(*(long *)in_RSI + 0x20))(local_20);
        QTransform::map((QPainterPath *)&local_10);
        QPainterPath::~QPainterPath(local_20);
      }
      else {
        (**(code **)(*(long *)in_RSI + 0x20))(local_18);
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&in_RSI->field_0x8);
        qVar9 = QTransform::dx(&pQVar5->sceneTransform);
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&in_RSI->field_0x8);
        qVar10 = QTransform::dy(&pQVar5->sceneTransform);
        QPainterPath::translated(qVar9,qVar10);
        QPainterPath::~QPainterPath(local_18);
      }
      QPainterPath::controlPointRect();
      QRectF::operator&=((QRectF *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      QPainterPath::~QPainterPath((QPainterPath *)&local_10);
    }
    local_cc = 0;
    while( true ) {
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8);
      qVar6 = QList<QGraphicsItem_*>::size(&pQVar5->children);
      if (qVar6 <= local_cc) break;
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)&in_RSI->field_0x8);
      ppQVar7 = QList<QGraphicsItem_*>::at
                          ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffec0,
                           (qsizetype)in_stack_fffffffffffffeb8);
      pQVar1 = *ppQVar7;
      if (local_f1 != 0) {
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar1->d_ptr);
        *(ulong *)&pQVar5->field_0x160 =
             *(ulong *)&pQVar5->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
      }
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&pQVar1->d_ptr);
      if ((*(ulong *)&pQVar5->field_0x160 & 0x10000000000) == 0) break;
      if ((!bVar2) ||
         (pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&pQVar1->d_ptr),
         (*(ulong *)&pQVar5->field_0x160 & 0x4000000000) != 0)) {
        in_stack_fffffffffffffeb8 = (parameter_type)in_stack_00000000.yp;
        in_stack_fffffffffffffec0 = (QRectF *)in_stack_00000000.w;
        recursive_items_helper
                  (in_RSI,in_RDX,in_stack_00000000,in_RCX,in_R8,
                   (QTransform *)CONCAT44(in_R9D,in_stack_ffffffffffffff50),
                   (ItemSelectionMode)((ulong)in_XMM0_Qa >> 0x20),opacity_00,in_stack_00000020);
      }
      local_cc = local_cc + 1;
    }
  }
  if (local_c6 != 0) {
    QList<QGraphicsItem_*>::append((QList<QGraphicsItem_*> *)0xa26632,in_stack_fffffffffffffeb8);
  }
  if (bVar4 != 0) {
    while( true ) {
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&in_RSI->field_0x8);
      qVar6 = QList<QGraphicsItem_*>::size(&pQVar5->children);
      if (qVar6 <= local_cc) break;
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)&in_RSI->field_0x8);
      ppQVar7 = QList<QGraphicsItem_*>::at
                          ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffec0,
                           (qsizetype)in_stack_fffffffffffffeb8);
      pQVar1 = *ppQVar7;
      if (local_f1 != 0) {
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar1->d_ptr);
        *(ulong *)&pQVar5->field_0x160 =
             *(ulong *)&pQVar5->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
      }
      if ((!bVar2) ||
         (pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&pQVar1->d_ptr),
         (*(ulong *)&pQVar5->field_0x160 & 0x4000000000) != 0)) {
        in_stack_fffffffffffffeb8 = (parameter_type)in_stack_00000000.yp;
        in_stack_fffffffffffffec0 = (QRectF *)in_stack_00000000.w;
        recursive_items_helper
                  (in_RSI,in_RDX,in_stack_00000000,in_RCX,in_R8,
                   (QTransform *)CONCAT44(in_R9D,in_stack_ffffffffffffff50),
                   (ItemSelectionMode)((ulong)in_XMM0_Qa >> 0x20),opacity_00,in_stack_00000020);
      }
      local_cc = local_cc + 1;
    }
  }
LAB_00a267d2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneIndexPrivate::recursive_items_helper(QGraphicsItem *item, QRectF exposeRect,
                                                        QGraphicsSceneIndexIntersector intersect,
                                                        QList<QGraphicsItem *> *items,
                                                        const QTransform &viewTransform,
                                                        Qt::ItemSelectionMode mode,
                                                        qreal parentOpacity, const void *intersectData) const
{
    Q_ASSERT(item);
    if (!item->d_ptr->visible)
        return;

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity()))
        return;

    // Update the item's scene transform if dirty.
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    const bool wasDirtyParentSceneTransform = item->d_ptr->dirtySceneTransform && !itemIsUntransformable;
    if (wasDirtyParentSceneTransform) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
    }

    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                           || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape);
    bool processItem = !itemIsFullyTransparent;
    if (processItem) {
        processItem = intersect(item, exposeRect, mode, viewTransform, intersectData);
        if (!processItem && (!itemHasChildren || itemClipsChildrenToShape)) {
            if (wasDirtyParentSceneTransform)
                item->d_ptr->invalidateChildrenSceneTransform();
            return;
        }
    } // else we know for sure this item has children we must process.

    int i = 0;
    if (itemHasChildren) {
        // Sort children.
        item->d_ptr->ensureSortedChildren();

        // Clip to shape.
        if (itemClipsChildrenToShape && !itemIsUntransformable) {
            QPainterPath mappedShape = item->d_ptr->sceneTransformTranslateOnly
                                     ? item->shape().translated(item->d_ptr->sceneTransform.dx(),
                                                                item->d_ptr->sceneTransform.dy())
                                     : item->d_ptr->sceneTransform.map(item->shape());
            exposeRect &= mappedShape.controlPointRect();
        }

        // Process children behind
        for (i = 0; i < item->d_ptr->children.size(); ++i) {
            QGraphicsItem *child = item->d_ptr->children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (!(child->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent))
                break;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            recursive_items_helper(child, exposeRect, intersect, items, viewTransform,
                                   mode, opacity, intersectData);
        }
    }

    // Process item
    if (processItem)
        items->append(item);

    // Process children in front
    if (itemHasChildren) {
        for (; i < item->d_ptr->children.size(); ++i) {
            QGraphicsItem *child = item->d_ptr->children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            recursive_items_helper(child, exposeRect, intersect, items, viewTransform,
                                   mode, opacity, intersectData);
        }
    }
}